

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall
InterpGCTest_Collect_Basic_Test::InterpGCTest_Collect_Basic_Test
          (InterpGCTest_Collect_Basic_Test *this)

{
  Features local_1b;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_0023cbe8;
  local_1b.exceptions_enabled_ = false;
  local_1b.mutable_globals_enabled_ = true;
  local_1b.sat_float_to_int_enabled_ = true;
  local_1b.sign_extension_enabled_ = true;
  local_1b.simd_enabled_ = true;
  local_1b.threads_enabled_ = false;
  local_1b.function_references_enabled_ = false;
  local_1b.multi_value_enabled_ = true;
  local_1b.tail_call_enabled_ = false;
  local_1b.bulk_memory_enabled_ = true;
  local_1b.reference_types_enabled_ = true;
  local_1b.annotations_enabled_ = false;
  local_1b.code_metadata_enabled_ = false;
  local_1b.gc_enabled_ = false;
  local_1b.memory64_enabled_ = false;
  local_1b.multi_memory_enabled_ = false;
  local_1b.extended_const_enabled_ = false;
  local_1b.relaxed_simd_enabled_ = false;
  local_1b.custom_page_sizes_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpGCTest).super_InterpTest.store_,&local_1b);
  memset(&(this->super_InterpGCTest).super_InterpTest.module_desc_,0,0x150);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_0023c890;
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_Basic) {
  auto foreign = Foreign::New(store_, nullptr);
  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 1, after_new);

  // Remove root, but object is not destroyed until collect.
  foreign.reset();
  EXPECT_EQ(after_new, store_.object_count());
}